

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

void duckdb::ConstructSortKeyList<duckdb::SortKeyListEntry>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyConstructInfo *info)

{
  data_t dVar1;
  unsafe_vector<idx_t> *puVar2;
  sel_t *psVar3;
  pointer puVar4;
  data_ptr_t pdVar5;
  unsigned_long uVar6;
  data_ptr_t pdVar7;
  long lVar8;
  long lVar9;
  SortKeyChunk chunk_00;
  bool bVar10;
  reference this;
  type vector_data_00;
  idx_t iVar11;
  ulong uVar12;
  ulong row_idx;
  undefined7 uStack_37;
  
  puVar2 = info->offsets;
  for (iVar11 = chunk.start; iVar11 < chunk.end; iVar11 = iVar11 + 1) {
    uVar12 = iVar11;
    if (((undefined1  [32])chunk & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
      uVar12 = chunk.result_index;
    }
    psVar3 = ((vector_data->format).sel)->sel_vector;
    row_idx = iVar11;
    if (psVar3 != (sel_t *)0x0) {
      row_idx = (ulong)psVar3[iVar11];
    }
    puVar4 = (puVar2->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = info->result_data[uVar12];
    bVar10 = TemplatedValidityMask<unsigned_long>::RowIsValid
                       (&(vector_data->format).validity.super_TemplatedValidityMask<unsigned_long>,
                        row_idx);
    uVar6 = puVar4[uVar12];
    if (bVar10) {
      dVar1 = vector_data->valid_byte;
      puVar4[uVar12] = uVar6 + 1;
      pdVar5[uVar6] = dVar1;
      pdVar7 = (vector_data->format).data;
      lVar8 = *(long *)(pdVar7 + row_idx * 0x10 + 8);
      if (lVar8 != 0) {
        lVar9 = *(long *)(pdVar7 + row_idx * 0x10);
        this = vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
               ::get<true>(&vector_data->child_data,0);
        vector_data_00 =
             unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
             ::operator*(this);
        chunk_00._25_7_ = uStack_37;
        chunk_00.has_result_index = true;
        chunk_00.end = lVar8 + lVar9;
        chunk_00.start = lVar9;
        chunk_00.result_index = uVar12;
        ConstructSortKeyRecursive(vector_data_00,chunk_00,info);
      }
      bVar10 = info->flip_bytes;
      uVar6 = puVar4[uVar12];
      puVar4[uVar12] = uVar6 + 1;
      pdVar5[uVar6] = -bVar10;
    }
    else {
      dVar1 = vector_data->null_byte;
      puVar4[uVar12] = uVar6 + 1;
      pdVar5[uVar6] = dVar1;
    }
  }
  return;
}

Assistant:

void ConstructSortKeyList(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyConstructInfo &info) {
	auto &offsets = info.offsets;
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto result_index = chunk.GetResultIndex(r);
		auto idx = vector_data.format.sel->get_index(r);
		auto &offset = offsets[result_index];
		auto result_ptr = info.result_data[result_index];
		if (!vector_data.format.validity.RowIsValid(idx)) {
			// NULL value - write the null byte and skip
			result_ptr[offset++] = vector_data.null_byte;
			if (!OP::IsArray()) {
				// for arrays we always write the child elements - also if the top-level array is NULL
				continue;
			}
		} else {
			// valid value - write the validity byte
			result_ptr[offset++] = vector_data.valid_byte;
		}

		auto list_entry = OP::GetListEntry(vector_data, idx);
		// recurse and write the list elements
		if (list_entry.length > 0) {
			SortKeyChunk child_chunk(list_entry.offset, list_entry.offset + list_entry.length, result_index);
			ConstructSortKeyRecursive(*vector_data.child_data[0], child_chunk, info);
		}

		// write the end-of-list delimiter
		result_ptr[offset++] = static_cast<data_t>(info.flip_bytes ? ~SortKeyVectorData::LIST_DELIMITER
		                                                           : SortKeyVectorData::LIST_DELIMITER);
	}
}